

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

mg_path * mg_path_copy_ca(mg_path *path,mg_allocator *allocator)

{
  uint uVar1;
  mg_path *buf;
  mg_node *pmVar2;
  mg_unbound_relationship *pmVar3;
  uint32_t i;
  ulong uVar4;
  uint32_t i_2;
  
  buf = mg_path_alloc(path->node_count,path->relationship_count,path->sequence_length,
                      &mg_system_allocator);
  if (buf != (mg_path *)0x0) {
    buf->node_count = 0;
    for (uVar4 = 0; uVar4 < path->node_count; uVar4 = uVar4 + 1) {
      pmVar2 = mg_node_copy_ca(path->nodes[uVar4],allocator);
      buf->nodes[uVar4] = pmVar2;
      if (buf->nodes[uVar4] == (mg_node *)0x0) goto LAB_00109625;
      buf->node_count = buf->node_count + 1;
    }
    buf->relationship_count = 0;
    uVar4 = 0;
    while( true ) {
      if (path->relationship_count <= uVar4) {
        uVar1 = path->sequence_length;
        buf->sequence_length = uVar1;
        memcpy(buf->sequence,path->sequence,(ulong)uVar1 << 3);
        return buf;
      }
      pmVar3 = mg_unbound_relationship_copy_ca(path->relationships[uVar4],allocator);
      buf->relationships[uVar4] = pmVar3;
      if (buf->relationships[uVar4] == (mg_unbound_relationship *)0x0) break;
      buf->relationship_count = buf->relationship_count + 1;
      uVar4 = uVar4 + 1;
    }
LAB_00109625:
    for (uVar4 = 0; uVar4 < buf->node_count; uVar4 = uVar4 + 1) {
      mg_node_destroy(buf->nodes[uVar4]);
    }
    for (uVar4 = 0; uVar4 < buf->relationship_count; uVar4 = uVar4 + 1) {
      mg_unbound_relationship_destroy(buf->relationships[uVar4]);
    }
    mg_allocator_free(&mg_system_allocator,buf);
  }
  return (mg_path *)0x0;
}

Assistant:

mg_path *mg_path_copy_ca(const mg_path *path, mg_allocator *allocator) {
  mg_path *npath = mg_path_alloc(path->node_count, path->relationship_count,
                                 path->sequence_length, &mg_system_allocator);
  if (!npath) {
    return NULL;
  }
  npath->node_count = 0;
  for (uint32_t i = 0; i < path->node_count; ++i) {
    npath->nodes[i] = mg_node_copy_ca(path->nodes[i], allocator);
    if (!npath->nodes[i]) {
      goto cleanup;
    }
    npath->node_count++;
  }
  npath->relationship_count = 0;
  for (uint32_t i = 0; i < path->relationship_count; ++i) {
    npath->relationships[i] =
        mg_unbound_relationship_copy_ca(path->relationships[i], allocator);
    if (!npath->relationships[i]) {
      goto cleanup;
    }
    npath->relationship_count++;
  }
  npath->sequence_length = path->sequence_length;
  memcpy(npath->sequence, path->sequence,
         path->sequence_length * sizeof(int64_t));
  return npath;

cleanup:
  for (uint32_t i = 0; i < npath->node_count; ++i) {
    mg_node_destroy(npath->nodes[i]);
  }
  for (uint32_t i = 0; i < npath->relationship_count; ++i) {
    mg_unbound_relationship_destroy(npath->relationships[i]);
  }
  mg_allocator_free(&mg_system_allocator, npath);
  return NULL;
}